

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

bool __thiscall ON_Hatch::SetGradientRepeat(ON_Hatch *this,double repeat)

{
  ON_GradientColorData *pOVar1;
  ON_GradientColorData *data;
  double repeat_local;
  ON_Hatch *this_local;
  
  pOVar1 = ON_GradientColorData::FromObject((ON_Object *)this);
  if (((pOVar1 != (ON_GradientColorData *)0x0) || (repeat != 0.0)) || (NAN(repeat))) {
    pOVar1 = ON_GradientColorData::FromObject((ON_Object *)this,true);
    if (pOVar1 == (ON_GradientColorData *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      pOVar1->m_repeat = repeat;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Hatch::SetGradientRepeat(double repeat)
{
  ON_GradientColorData* data = ON_GradientColorData::FromObject(this);
  if (nullptr == data && 0 == repeat)
    return true;

  data = ON_GradientColorData::FromObject(this, true);
  if (nullptr == data)
    return false;
  
  data->m_repeat = repeat;
  return true;
}